

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O3

void __thiscall CDirectiveSkip::CDirectiveSkip(CDirectiveSkip *this,Expression *expression)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CDirectiveSkip_001c1128;
  (this->expression).expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (expression->expression).
           super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (expression->expression).
           super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->expression).expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->expression).constExpression = expression->constExpression;
  return;
}

Assistant:

CDirectiveSkip::CDirectiveSkip(Expression& expression)
	: expression(expression) {}